

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

char * mpack_expect_bin_alloc(mpack_reader_t *reader,size_t maxsize,size_t *size)

{
  uint32_t uVar1;
  char *pcVar2;
  size_t sVar3;
  
  *size = 0;
  sVar3 = 0xffffffff;
  if (maxsize < 0xffffffff) {
    sVar3 = maxsize;
  }
  uVar1 = mpack_expect_bin(reader);
  if ((uint)sVar3 < uVar1) {
    uVar1 = 0;
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_type;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_type);
        uVar1 = 0;
      }
    }
  }
  pcVar2 = mpack_read_bytes_alloc_impl(reader,(ulong)uVar1,false);
  if (pcVar2 != (char *)0x0) {
    *size = (ulong)uVar1;
  }
  return pcVar2;
}

Assistant:

char* mpack_expect_bin_alloc(mpack_reader_t* reader, size_t maxsize, size_t* size) {
    mpack_assert(size != NULL, "size cannot be NULL");
    *size = 0;

    if (maxsize > UINT32_MAX)
        maxsize = UINT32_MAX;

    size_t length = mpack_expect_bin_max(reader, (uint32_t)maxsize);
    char* data = mpack_read_bytes_alloc(reader, length);
    mpack_done_bin(reader);

    if (data)
        *size = length;
    return data;
}